

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolInitialize(SUNLinearSolver S,int myid)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double stop_time;
  double start_time;
  int failure;
  int myid_local;
  SUNLinearSolver S_local;
  
  dVar2 = get_time();
  iVar1 = SUNLinSolInitialize(S);
  dVar3 = get_time();
  if (iVar1 == 0) {
    if ((myid == 0) && (printf("    PASSED test -- SUNLinSolInitialize \n"), print_time != 0)) {
      printf("    SUNLinSolInitialize Time: %22.15e \n \n",dVar3 - dVar2);
    }
    S_local._4_4_ = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolInitialize check, Proc %d \n",(ulong)(uint)myid);
    if (print_time != 0) {
      printf("    SUNLinSolInitialize Time: %22.15e \n \n",dVar3 - dVar2);
    }
    S_local._4_4_ = 1;
  }
  return S_local._4_4_;
}

Assistant:

int Test_SUNLinSolInitialize(SUNLinearSolver S, int myid)
{
  int       failure;
  double    start_time, stop_time;

  start_time = get_time(); 
  failure = SUNLinSolInitialize(S);
  stop_time = get_time(); 
  
  if (failure) {
    printf(">>> FAILED test -- SUNLinSolInitialize check, Proc %d \n", myid);
    PRINT_TIME("    SUNLinSolInitialize Time: %22.15e \n \n", stop_time - start_time);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNLinSolInitialize \n");
    PRINT_TIME("    SUNLinSolInitialize Time: %22.15e \n \n", stop_time - start_time);
  }    
  
  return(0);
}